

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::InitializeFromParent(cmMakefile *this,cmMakefile *parent)

{
  PolicyStatus PVar1;
  char *pcVar2;
  pointer s;
  allocator local_a9;
  string defPropName;
  string local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  string local_50;
  
  Internals::InitializeDefinitions((this->Internal).x_,parent);
  std::__cxx11::string::string
            ((string *)&defPropName,"CMAKE_CURRENT_SOURCE_DIR",(allocator *)&local_88);
  pcVar2 = cmState::Snapshot::GetCurrentSourceDirectory(&this->StateSnapshot);
  AddDefinition(this,&defPropName,pcVar2);
  std::__cxx11::string::~string((string *)&defPropName);
  std::__cxx11::string::string
            ((string *)&defPropName,"CMAKE_CURRENT_BINARY_DIR",(allocator *)&local_88);
  pcVar2 = cmState::Snapshot::GetCurrentBinaryDirectory(&this->StateSnapshot);
  AddDefinition(this,&defPropName,pcVar2);
  std::__cxx11::string::~string((string *)&defPropName);
  std::vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>>::
  insert<__gnu_cxx::__normal_iterator<cmValueWithOrigin_const*,std::vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>>>,void>
            ((vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>> *)
             &this->IncludeDirectoriesEntries,
             (this->IncludeDirectoriesEntries).
             super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (parent->IncludeDirectoriesEntries).
             super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
             super__Vector_impl_data._M_start,
             (parent->IncludeDirectoriesEntries).
             super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>>::
  insert<__gnu_cxx::__normal_iterator<cmValueWithOrigin_const*,std::vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>>>,void>
            ((vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>> *)
             &this->CompileOptionsEntries,
             (this->CompileOptionsEntries).
             super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (parent->CompileOptionsEntries).
             super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
             super__Vector_impl_data._M_start,
             (parent->CompileOptionsEntries).
             super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>>::
  insert<__gnu_cxx::__normal_iterator<cmValueWithOrigin_const*,std::vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>>>,void>
            ((vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>> *)
             &this->CompileDefinitionsEntries,
             (this->CompileDefinitionsEntries).
             super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (parent->CompileDefinitionsEntries).
             super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
             super__Vector_impl_data._M_start,
             (parent->CompileDefinitionsEntries).
             super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->SystemIncludeDirectories)._M_t,&(parent->SystemIncludeDirectories)._M_t);
  std::__cxx11::string::_M_assign((string *)&this->DefineFlags);
  std::__cxx11::string::_M_assign((string *)&this->DefineFlagsOrig);
  std::__cxx11::string::string
            ((string *)&defPropName,"IMPLICIT_DEPENDS_INCLUDE_TRANSFORM",(allocator *)&configs);
  std::__cxx11::string::string((string *)&local_88,"IMPLICIT_DEPENDS_INCLUDE_TRANSFORM",&local_a9);
  pcVar2 = GetProperty(parent,&local_88);
  SetProperty(this,&defPropName,pcVar2);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&defPropName);
  PVar1 = GetPolicyStatus(this,CMP0043);
  if (PVar1 < NEW) {
    std::__cxx11::string::string((string *)&defPropName,"COMPILE_DEFINITIONS",(allocator *)&configs)
    ;
    std::__cxx11::string::string((string *)&local_88,"COMPILE_DEFINITIONS",&local_a9);
    pcVar2 = GetProperty(parent,&local_88);
    SetProperty(this,&defPropName,pcVar2);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&defPropName);
    configs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    configs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    configs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetConfigurations(&local_50,this,&configs,true);
    std::__cxx11::string::~string((string *)&local_50);
    for (s = configs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        s != configs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; s = s + 1) {
      std::__cxx11::string::string
                ((string *)&defPropName,"COMPILE_DEFINITIONS_",(allocator *)&local_88);
      cmsys::SystemTools::UpperCase(&local_88,s);
      std::__cxx11::string::append((string *)&defPropName);
      std::__cxx11::string::~string((string *)&local_88);
      pcVar2 = GetProperty(parent,&defPropName);
      SetProperty(this,&defPropName,pcVar2);
      std::__cxx11::string::~string((string *)&defPropName);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&configs);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>
  ::operator=(&this->LinkLibraries,&parent->LinkLibraries);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->LinkDirectories,&parent->LinkDirectories);
  std::__cxx11::string::_M_assign((string *)&this->ProjectName);
  std::__cxx11::string::_M_assign((string *)&this->IncludeFileRegularExpression);
  std::__cxx11::string::_M_assign((string *)&this->ComplainFileRegularExpression);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=(&(this->ImportedTargets)._M_h,&(parent->ImportedTargets)._M_h);
  return;
}

Assistant:

void cmMakefile::InitializeFromParent(cmMakefile* parent)
{
  // Initialize definitions with the closure of the parent scope.
  this->Internal->InitializeDefinitions(parent);

  this->AddDefinition("CMAKE_CURRENT_SOURCE_DIR",
                      this->GetCurrentSourceDirectory());
  this->AddDefinition("CMAKE_CURRENT_BINARY_DIR",
                      this->GetCurrentBinaryDirectory());

  const std::vector<cmValueWithOrigin>& parentIncludes =
                                        parent->GetIncludeDirectoriesEntries();
  this->IncludeDirectoriesEntries.insert(this->IncludeDirectoriesEntries.end(),
                                         parentIncludes.begin(),
                                         parentIncludes.end());

  const std::vector<cmValueWithOrigin>& parentOptions =
                                        parent->GetCompileOptionsEntries();
  this->CompileOptionsEntries.insert(this->CompileOptionsEntries.end(),
                                     parentOptions.begin(),
                                     parentOptions.end());

  const std::vector<cmValueWithOrigin>& parentDefines =
                                      parent->GetCompileDefinitionsEntries();
  this->CompileDefinitionsEntries.insert(this->CompileDefinitionsEntries.end(),
                                         parentDefines.begin(),
                                         parentDefines.end());

  this->SystemIncludeDirectories = parent->SystemIncludeDirectories;

  // define flags
  this->DefineFlags = parent->DefineFlags;
  this->DefineFlagsOrig = parent->DefineFlagsOrig;

  // Include transform property.  There is no per-config version.
  {
  const char* prop = "IMPLICIT_DEPENDS_INCLUDE_TRANSFORM";
  this->SetProperty(prop, parent->GetProperty(prop));
  }

  // compile definitions property and per-config versions
  cmPolicies::PolicyStatus polSt = this->GetPolicyStatus(cmPolicies::CMP0043);
  if (polSt == cmPolicies::WARN || polSt == cmPolicies::OLD)
    {
    this->SetProperty("COMPILE_DEFINITIONS",
                      parent->GetProperty("COMPILE_DEFINITIONS"));
    std::vector<std::string> configs;
    this->GetConfigurations(configs);
    for(std::vector<std::string>::const_iterator ci = configs.begin();
        ci != configs.end(); ++ci)
      {
      std::string defPropName = "COMPILE_DEFINITIONS_";
      defPropName += cmSystemTools::UpperCase(*ci);
      const char* prop = parent->GetProperty(defPropName);
      this->SetProperty(defPropName, prop);
      }
    }

  // link libraries
  this->LinkLibraries = parent->LinkLibraries;

  // link directories
  this->LinkDirectories = parent->LinkDirectories;

  // the initial project name
  this->ProjectName = parent->ProjectName;

  // Copy include regular expressions.
  this->IncludeFileRegularExpression = parent->IncludeFileRegularExpression;
  this->ComplainFileRegularExpression = parent->ComplainFileRegularExpression;

  // Imported targets.
  this->ImportedTargets = parent->ImportedTargets;
}